

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall re2::Regexp::ParseState::~ParseState(ParseState *this)

{
  Regexp *pRVar1;
  string *this_00;
  RegexpOp RVar2;
  Regexp *local_20;
  Regexp *re;
  Regexp *next;
  ParseState *this_local;
  
  local_20 = this->stacktop_;
  while (local_20 != (Regexp *)0x0) {
    pRVar1 = local_20->down_;
    local_20->down_ = (Regexp *)0x0;
    RVar2 = op(local_20);
    if ((RVar2 == (kRegexpCharClass|kRegexpEmptyMatch)) &&
       (this_00 = (string *)(local_20->field_7).field_1.name_, this_00 != (string *)0x0)) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00);
    }
    Decref(local_20);
    local_20 = pRVar1;
  }
  return;
}

Assistant:

Regexp::ParseState::~ParseState() {
  Regexp* next;
  for (Regexp* re = stacktop_; re != NULL; re = next) {
    next = re->down_;
    re->down_ = NULL;
    if (re->op() == kLeftParen)
      delete re->name_;
    re->Decref();
  }
}